

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O0

Vec_Ptr_t * Saig_ManCollectedDiffNodes(Aig_Man_t *p0,Aig_Man_t *p1)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  int local_34;
  int i;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  Vec_Ptr_t *vNodes;
  Aig_Man_t *p1_local;
  Aig_Man_t *p0_local;
  
  Aig_ManIncrementTravId(p0);
  p = Vec_PtrAlloc(1000);
  local_34 = 0;
  do {
    iVar1 = Vec_PtrSize(p0->vObjs);
    if (iVar1 <= local_34) {
      local_34 = 0;
      while( true ) {
        iVar1 = Saig_ManRegNum(p0);
        if (iVar1 <= local_34) {
          return p;
        }
        pAVar3 = Saig_ManLi(p0,local_34);
        pAVar4 = Saig_ManLo(p0,local_34);
        iVar1 = Aig_ObjIsTravIdCurrent(p0,pAVar3);
        iVar2 = Aig_ObjIsTravIdCurrent(p0,pAVar4);
        if (iVar1 != iVar2) break;
        local_34 = local_34 + 1;
      }
      __assert_fail("Aig_ObjIsTravIdCurrent(p0, pObj0) == Aig_ObjIsTravIdCurrent(p0, pObj1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigWnd.c"
                    ,0x240,"Vec_Ptr_t *Saig_ManCollectedDiffNodes(Aig_Man_t *, Aig_Man_t *)");
    }
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p0->vObjs,local_34);
    if (pAVar3 != (Aig_Obj_t *)0x0) {
      pAVar4 = Aig_ObjRepr(p0,pAVar3);
      if (pAVar4 == (Aig_Obj_t *)0x0) {
        Aig_ObjSetTravIdCurrent(p0,pAVar3);
        iVar1 = Aig_ObjIsNode(pAVar3);
        if ((iVar1 != 0) || (iVar1 = Aig_ObjIsCi(pAVar3), iVar1 != 0)) {
          Vec_PtrPush(p,pAVar3);
        }
      }
      else {
        pAVar4 = Aig_ObjRepr(p1,pAVar4);
        if (pAVar3 != pAVar4) {
          __assert_fail("pObj0 == Aig_ObjRepr( p1, pObj1 )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigWnd.c"
                        ,0x235,"Vec_Ptr_t *Saig_ManCollectedDiffNodes(Aig_Man_t *, Aig_Man_t *)");
        }
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Saig_ManCollectedDiffNodes( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj0, * pObj1;
    int i;
    // collect nodes that are not linked
    Aig_ManIncrementTravId( p0 );
    vNodes = Vec_PtrAlloc( 1000 );
    Aig_ManForEachObj( p0, pObj0, i )
    {
        pObj1 = Aig_ObjRepr( p0, pObj0 );
        if ( pObj1 != NULL )
        {
            assert( pObj0 == Aig_ObjRepr( p1, pObj1 ) );   
            continue;
        }
        // mark and collect unmatched objects
        Aig_ObjSetTravIdCurrent( p0, pObj0 ); 
        if ( Aig_ObjIsNode(pObj0) || Aig_ObjIsCi(pObj0) )
            Vec_PtrPush( vNodes, pObj0 );
    }
    // make sure LI/LO are labeled/unlabeled mutually
    Saig_ManForEachLiLo( p0, pObj0, pObj1, i )
        assert( Aig_ObjIsTravIdCurrent(p0, pObj0) == 
                Aig_ObjIsTravIdCurrent(p0, pObj1) );
    return vNodes;
}